

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

StringPtr kj::consumeLine(char **ptr)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  StringPtr SVar6;
  
  pcVar2 = *ptr;
  pcVar3 = pcVar2 + -1;
  for (; (*pcVar2 == '\t' || (pcVar4 = pcVar2, *pcVar2 == ' ')); pcVar2 = pcVar2 + 1) {
    pcVar3 = pcVar3 + 1;
  }
  while( true ) {
    while (cVar1 = *pcVar4, cVar1 != '\n') {
      if (cVar1 == '\r') {
        if (pcVar4[1] == '\n') {
          pcVar5 = pcVar4 + 2;
        }
        else {
          pcVar5 = pcVar4 + 1;
        }
        if ((pcVar4[(ulong)(pcVar4[1] == '\n') + 1] != ' ') &&
           (pcVar4[(ulong)(pcVar4[1] == '\n') + 1] != '\t')) goto LAB_0039e4db;
        *pcVar4 = ' ';
        pcVar5[-1] = ' ';
        pcVar4 = pcVar5;
      }
      else {
        if (cVar1 == '\0') {
          *ptr = pcVar4;
          goto LAB_0039e4e1;
        }
        pcVar4 = pcVar4 + 1;
      }
    }
    pcVar5 = pcVar4 + 1;
    if ((pcVar4[1] != ' ') && (pcVar4[1] != '\t')) break;
    *pcVar4 = ' ';
    pcVar4 = pcVar5;
  }
LAB_0039e4db:
  *ptr = pcVar5;
  *pcVar4 = '\0';
LAB_0039e4e1:
  SVar6.content.size_ = (long)pcVar4 - (long)pcVar3;
  SVar6.content.ptr = pcVar2;
  return (StringPtr)SVar6.content;
}

Assistant:

static kj::StringPtr consumeLine(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  for (;;) {
    switch (*p) {
      case '\0':
        ptr = p;
        return kj::StringPtr(start, p);

      case '\r': {
        char* end = p++;
        if (*p == '\n') ++p;

        if (*p == ' ' || *p == '\t') {
          // Whoa, continuation line. These are deprecated, but historically a line starting with
          // a space was treated as a continuation of the previous line. The behavior should be
          // the same as if the \r\n were replaced with spaces, so let's do that here to prevent
          // confusion later.
          *end = ' ';
          p[-1] = ' ';
          break;
        }

        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      case '\n': {
        char* end = p++;

        if (*p == ' ' || *p == '\t') {
          // Whoa, continuation line. These are deprecated, but historically a line starting with
          // a space was treated as a continuation of the previous line. The behavior should be
          // the same as if the \n were replaced with spaces, so let's do that here to prevent
          // confusion later.
          *end = ' ';
          break;
        }

        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      default:
        ++p;
        break;
    }
  }
}